

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::IsStructListValue
          (ProtoStreamObjectWriter *this,Field *field)

{
  bool bVar1;
  stringpiece_ssize_type extraout_RDX;
  StringPiece SVar2;
  StringPiece local_40;
  StringPiece local_30;
  
  StringPiece::StringPiece<std::allocator<char>>(&local_40,(field->type_url_).ptr_);
  SVar2.length_ = extraout_RDX;
  SVar2.ptr_ = (char *)local_40.length_;
  SVar2 = GetTypeWithoutUrl((converter *)local_40.ptr_,SVar2);
  StringPiece::StringPiece(&local_30,"google.protobuf.ListValue");
  bVar1 = operator==(SVar2,local_30);
  return bVar1;
}

Assistant:

bool ProtoStreamObjectWriter::IsStructListValue(
    const google::protobuf::Field& field) {
  return GetTypeWithoutUrl(field.type_url()) == kStructListValueType;
}